

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int record_hardlink(archive_read *a,cpio *cpio,archive_entry *entry)

{
  uint uVar1;
  int iVar2;
  dev_t dVar3;
  la_int64_t lVar4;
  links_entry *plVar5;
  char *pcVar6;
  int64_t ino;
  dev_t dev;
  links_entry *le;
  archive_entry *entry_local;
  cpio *cpio_local;
  archive_read *a_local;
  
  uVar1 = archive_entry_nlink(entry);
  if (uVar1 < 2) {
    a_local._4_4_ = 0;
  }
  else {
    dVar3 = archive_entry_dev(entry);
    lVar4 = archive_entry_ino64(entry);
    for (dev = (dev_t)cpio->links_head; dev != 0; dev = *(dev_t *)dev) {
      if ((*(dev_t *)(dev + 0x18) == dVar3) && (*(long *)(dev + 0x20) == lVar4)) {
        archive_entry_copy_hardlink(entry,*(char **)(dev + 0x28));
        iVar2 = *(int *)(dev + 0x10) + -1;
        *(int *)(dev + 0x10) = iVar2;
        if (iVar2 == 0) {
          if (*(long *)(dev + 8) != 0) {
            **(undefined8 **)(dev + 8) = *(undefined8 *)dev;
          }
          if (*(long *)dev != 0) {
            *(undefined8 *)(*(long *)dev + 8) = *(undefined8 *)(dev + 8);
          }
          if (cpio->links_head == (links_entry *)dev) {
            cpio->links_head = *(links_entry **)dev;
          }
          free(*(void **)(dev + 0x28));
          free((void *)dev);
        }
        return 0;
      }
    }
    plVar5 = (links_entry *)malloc(0x30);
    if (plVar5 == (links_entry *)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory adding file to list");
      a_local._4_4_ = -0x1e;
    }
    else {
      if (cpio->links_head != (links_entry *)0x0) {
        cpio->links_head->previous = plVar5;
      }
      plVar5->next = cpio->links_head;
      plVar5->previous = (links_entry *)0x0;
      cpio->links_head = plVar5;
      plVar5->dev = dVar3;
      plVar5->ino = lVar4;
      uVar1 = archive_entry_nlink(entry);
      plVar5->links = uVar1 - 1;
      pcVar6 = archive_entry_pathname(entry);
      pcVar6 = strdup(pcVar6);
      plVar5->name = pcVar6;
      if (plVar5->name == (char *)0x0) {
        archive_set_error(&a->archive,0xc,"Out of memory adding file to list");
        a_local._4_4_ = -0x1e;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
record_hardlink(struct archive_read *a,
    struct cpio *cpio, struct archive_entry *entry)
{
	struct links_entry      *le;
	dev_t dev;
	int64_t ino;

	if (archive_entry_nlink(entry) <= 1)
		return (ARCHIVE_OK);

	dev = archive_entry_dev(entry);
	ino = archive_entry_ino64(entry);

	/*
	 * First look in the list of multiply-linked files.  If we've
	 * already dumped it, convert this entry to a hard link entry.
	 */
	for (le = cpio->links_head; le; le = le->next) {
		if (le->dev == dev && le->ino == ino) {
			archive_entry_copy_hardlink(entry, le->name);

			if (--le->links <= 0) {
				if (le->previous != NULL)
					le->previous->next = le->next;
				if (le->next != NULL)
					le->next->previous = le->previous;
				if (cpio->links_head == le)
					cpio->links_head = le->next;
				free(le->name);
				free(le);
			}

			return (ARCHIVE_OK);
		}
	}

	le = (struct links_entry *)malloc(sizeof(struct links_entry));
	if (le == NULL) {
		archive_set_error(&a->archive,
		    ENOMEM, "Out of memory adding file to list");
		return (ARCHIVE_FATAL);
	}
	if (cpio->links_head != NULL)
		cpio->links_head->previous = le;
	le->next = cpio->links_head;
	le->previous = NULL;
	cpio->links_head = le;
	le->dev = dev;
	le->ino = ino;
	le->links = archive_entry_nlink(entry) - 1;
	le->name = strdup(archive_entry_pathname(entry));
	if (le->name == NULL) {
		archive_set_error(&a->archive,
		    ENOMEM, "Out of memory adding file to list");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}